

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O0

void __thiscall lzham::lzcompressor::state::state(state *this)

{
  long in_RDI;
  state *in_stack_fffffffffffffe50;
  undefined8 local_120;
  undefined8 local_100;
  undefined8 local_d8;
  undefined8 local_b8;
  undefined8 local_a0;
  undefined8 local_88;
  undefined8 local_70;
  undefined8 local_58;
  undefined8 local_40;
  undefined8 local_20;
  
  local_20 = in_RDI + 0x1c;
  do {
    adaptive_bit_model::adaptive_bit_model((adaptive_bit_model *)0x110582);
    local_20 = local_20 + 2;
  } while (local_20 != in_RDI + 0x61c);
  local_40 = in_RDI + 0x61c;
  do {
    adaptive_bit_model::adaptive_bit_model((adaptive_bit_model *)0x1105dd);
    local_40 = local_40 + 2;
  } while (local_40 != in_RDI + 0x634);
  local_58 = in_RDI + 0x634;
  do {
    adaptive_bit_model::adaptive_bit_model((adaptive_bit_model *)0x110638);
    local_58 = local_58 + 2;
  } while (local_58 != in_RDI + 0x64c);
  local_70 = in_RDI + 0x64c;
  do {
    adaptive_bit_model::adaptive_bit_model((adaptive_bit_model *)0x110693);
    local_70 = local_70 + 2;
  } while (local_70 != in_RDI + 0x664);
  local_88 = in_RDI + 0x664;
  do {
    adaptive_bit_model::adaptive_bit_model((adaptive_bit_model *)0x1106ee);
    local_88 = local_88 + 2;
  } while (local_88 != in_RDI + 0x67c);
  local_a0 = in_RDI + 0x67c;
  do {
    adaptive_bit_model::adaptive_bit_model((adaptive_bit_model *)0x110749);
    local_a0 = local_a0 + 2;
  } while (local_a0 != in_RDI + 0x694);
  local_b8 = in_RDI + 0x698;
  do {
    quasi_adaptive_huffman_data_model::quasi_adaptive_huffman_data_model
              ((quasi_adaptive_huffman_data_model *)0x1107af);
    local_b8 = local_b8 + 0x80;
  } while (local_b8 != in_RDI + 0x2698);
  local_d8 = in_RDI + 0x2698;
  do {
    quasi_adaptive_huffman_data_model::quasi_adaptive_huffman_data_model
              ((quasi_adaptive_huffman_data_model *)0x110819);
    local_d8 = local_d8 + 0x80;
  } while (local_d8 != in_RDI + 0x4698);
  quasi_adaptive_huffman_data_model::quasi_adaptive_huffman_data_model
            ((quasi_adaptive_huffman_data_model *)0x11085a);
  local_100 = in_RDI + 0x4718;
  do {
    quasi_adaptive_huffman_data_model::quasi_adaptive_huffman_data_model
              ((quasi_adaptive_huffman_data_model *)0x1108a1);
    local_100 = local_100 + 0x80;
  } while (local_100 != in_RDI + 0x4818);
  local_120 = in_RDI + 0x4818;
  do {
    quasi_adaptive_huffman_data_model::quasi_adaptive_huffman_data_model
              ((quasi_adaptive_huffman_data_model *)0x11090b);
    local_120 = local_120 + 0x80;
  } while (local_120 != in_RDI + 0x4918);
  quasi_adaptive_huffman_data_model::quasi_adaptive_huffman_data_model
            ((quasi_adaptive_huffman_data_model *)0x11094c);
  clear(in_stack_fffffffffffffe50);
  return;
}

Assistant:

lzcompressor::state::state()
   {
      clear();
   }